

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O3

void __thiscall xray_re::xr_scene_wallmarks::~xr_scene_wallmarks(xr_scene_wallmarks *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppwVar2;
  pointer pcVar3;
  
  (this->super_xr_scene_part)._vptr_xr_scene_part = (_func_int **)&PTR__xr_scene_wallmarks_0024b218;
  delete_elements<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>>
            (&this->m_slots);
  ppwVar2 = (this->m_slots).
            super__Vector_base<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppwVar2 != (pointer)0x0) {
    operator_delete(ppwVar2,(long)(this->m_slots).
                                  super__Vector_base<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppwVar2
                   );
  }
  pcVar3 = (this->m_texture)._M_dataplus._M_p;
  paVar1 = &(this->m_texture).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_shader)._M_dataplus._M_p;
  paVar1 = &(this->m_shader).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  xr_scene_part::~xr_scene_part(&this->super_xr_scene_part);
  return;
}

Assistant:

xr_scene_wallmarks::~xr_scene_wallmarks()
{
	delete_elements(m_slots);
}